

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O3

void __thiscall QEvdevKeyboardManager::~QEvdevKeyboardManager(QEvdevKeyboardManager *this)

{
  ~QEvdevKeyboardManager(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

QEvdevKeyboardManager::~QEvdevKeyboardManager()
{
}